

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O1

void __thiscall
polyscope::Structure::Structure(Structure *this,void **vtt,string *name_,string *subtypeName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  mat<4,_4,_float,_(glm::qualifier)0> value_;
  undefined1 auVar5 [40];
  string *name;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  undefined8 uVar10;
  undefined4 uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  string local_e0;
  string *local_c0;
  TransformationGizmo *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar6 [16];
  undefined1 auVar11 [16];
  
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uint32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::allocator<polyscope::render::ManagedBuffer<unsigned_int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_int32.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<int>_*,_std::allocator<polyscope::render::ManagedBuffer<int>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_uvec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr3vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr4vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_4UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec4.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<4,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_arr2vec3.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*,_std::allocator<polyscope::render::ManagedBuffer<std::array<glm::vec<3,_float,_(glm::qualifier)0>,_2UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_float.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<float>_*,_std::allocator<polyscope::render::ManagedBuffer<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_double.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<double>_*,_std::allocator<polyscope::render::ManagedBuffer<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ManagedBufferRegistry).managedBufferMap_vec2.allBuffers.
  super__Vector_base<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*,_std::allocator<polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pp_Var3 = (_func_int **)*vtt;
  this->_vptr_Structure = pp_Var3;
  *(void **)((long)&this->_vptr_Structure + (long)pp_Var3[-3]) = vtt[1];
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar4,pcVar4 + name_->_M_string_length);
  pcVar4 = (subtypeName->_M_dataplus)._M_p;
  local_120[0] = local_110;
  local_c0 = &this->name;
  local_b0 = paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar4,pcVar4 + subtypeName->_M_string_length);
  std::__cxx11::string::append((char *)local_120);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_120,(ulong)(this->name)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_f0 = *plVar8;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar8;
    local_100 = (long *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  paVar1 = &local_e0.field_2;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  PersistentValue<bool>::PersistentValue(&this->enabled,&local_e0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0]);
  }
  pcVar4 = (subtypeName->_M_dataplus)._M_p;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar4,pcVar4 + subtypeName->_M_string_length);
  std::__cxx11::string::append((char *)local_120);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_120,(ulong)(this->name)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_f0 = *plVar8;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar8;
    local_100 = (long *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70 = 0x3f800000;
  uStack_6c = 0;
  uStack_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0x3f800000;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0x3f800000;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0x3f800000;
  auVar5 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  value_.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  value_.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  auVar11 = auVar5._0_16_;
  auVar6 = auVar5._16_16_;
  value_.value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar11._0_4_;
  value_.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar11._4_4_;
  value_.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar11._8_4_;
  value_.value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar11._12_4_;
  value_.value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar6._0_4_;
  value_.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar6._4_4_;
  value_.value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar6._8_4_;
  value_.value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar6._12_4_;
  value_.value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar5._32_4_;
  value_.value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar5._36_4_;
  value_.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  value_.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  value_.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  value_.value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->objectTransform,&local_e0,value_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0]);
  }
  local_120[0] = local_110;
  pcVar4 = (subtypeName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar4,pcVar4 + subtypeName->_M_string_length);
  std::__cxx11::string::append((char *)local_120);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_120,(ulong)(this->name)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_f0 = *plVar8;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar8;
    local_100 = (long *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  PersistentValue<float>::PersistentValue(&this->transparency,&local_e0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0]);
  }
  pcVar4 = (subtypeName->_M_dataplus)._M_p;
  local_100 = &local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar4,pcVar4 + subtypeName->_M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_100,(ulong)(this->name)._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_b8 = &this->transformGizmo;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_a8.field_2._M_allocated_capacity = *psVar9;
    local_a8.field_2._8_8_ = plVar7[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar9;
    local_a8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  TransformationGizmo::TransformationGizmo
            (local_b8,&local_a8,&(this->objectTransform).value,&this->objectTransform);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  pcVar4 = (subtypeName->_M_dataplus)._M_p;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar4,pcVar4 + subtypeName->_M_string_length);
  std::__cxx11::string::append((char *)local_120);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_120,(ulong)(this->name)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_f0 = *plVar8;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar8;
    local_100 = (long *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  PersistentValue<bool>::PersistentValue(&this->cullWholeElements,&local_e0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0]);
  }
  pcVar4 = (subtypeName->_M_dataplus)._M_p;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar4,pcVar4 + subtypeName->_M_string_length);
  std::__cxx11::string::append((char *)local_120);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_120,(ulong)(this->name)._M_dataplus._M_p);
  plVar8 = plVar7 + 2;
  if ((long *)*plVar7 == plVar8) {
    local_f0 = *plVar8;
    lStack_e8 = plVar7[3];
    local_100 = &local_f0;
  }
  else {
    local_f0 = *plVar8;
    local_100 = (long *)*plVar7;
  }
  local_f8 = plVar7[1];
  *plVar7 = (long)plVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  psVar9 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0.field_2._8_8_ = plVar7[3];
    local_e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar9;
    local_e0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  PersistentValue<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::PersistentValue(&this->ignoredSlicePlaneNames,&local_e0,&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  name = local_c0;
  if (local_120[0] != local_110) {
    operator_delete(local_120[0]);
  }
  uVar12 = 0xc4424000;
  uVar10 = 0xc4424000c4424000;
  auVar11._8_4_ = uVar12;
  auVar11._0_8_ = uVar10;
  auVar11._12_4_ = 0xc4424000;
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>_> =
       (_Tuple_impl<1UL,_glm::vec<3,_float,_(glm::qualifier)0>_>)auVar11._0_12_;
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xc4424000;
  uVar2 = vmovlps_avx(auVar11);
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)uVar2;
  (this->objectSpaceBoundingBox).
  super__Tuple_impl<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_glm::vec<3,_float,_(glm::qualifier)0>_>
  .super__Head_base<0UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)(int)((ulong)uVar2 >> 0x20);
  this->objectSpaceLengthScale = -777.0;
  validateName(name);
  return;
}

Assistant:

Structure::Structure(std::string name_, std::string subtypeName)
    : name(name_), enabled(subtypeName + "#" + name + "#enabled", true),
      objectTransform(subtypeName + "#" + name + "#object_transform", glm::mat4(1.0)),
      transparency(subtypeName + "#" + name + "#transparency", 1.0),
      transformGizmo(subtypeName + "#" + name + "#transform_gizmo", objectTransform.get(), &objectTransform),
      cullWholeElements(subtypeName + "#" + name + "#cullWholeElements", false),
      ignoredSlicePlaneNames(subtypeName + "#" + name + "#ignored_slice_planes", {}),
      objectSpaceBoundingBox(
          std::tuple<glm::vec3, glm::vec3>{glm::vec3{-777, -777, -777}, glm::vec3{-777, -777, -777}}),
      objectSpaceLengthScale(-777) {
  validateName(name);
}